

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createMaterialFrom(SemanticParser *this,SP *in)

{
  element_type *this_00;
  bool bVar1;
  ostream *poVar2;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  SP SVar4;
  string type;
  allocator<char> local_121;
  string local_120;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_50;
  string local_40;
  
  if (in_RDX->_M_ptr == (element_type *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"warning: empty material!");
    std::endl<char,std::char_traits<char>>(poVar2);
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var3._M_pi = extraout_RDX;
    goto LAB_0013c0eb;
  }
  bVar1 = std::operator==(&in_RDX->_M_ptr->type,"");
  this_00 = in_RDX->_M_ptr;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"type",&local_121);
    syntactic::ParamSet::getParamString(&local_120,&this_00->super_ParamSet,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::__cxx11::string::string((string *)&local_120,(string *)&this_00->type);
  }
  bVar1 = std::operator==(&local_120,"");
  if (bVar1) {
LAB_0013bddf:
    std::make_shared<pbrt::Material>();
  }
  else {
    bVar1 = std::operator==(&local_120,"plastic");
    if (bVar1) {
      std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,in_RDX);
      createMaterial_plastic(this,in);
      this_01 = &local_50._M_refcount;
    }
    else {
      bVar1 = std::operator==(&local_120,"matte");
      if (bVar1) {
        std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,in_RDX);
        createMaterial_matte(this,in);
        this_01 = &local_60._M_refcount;
      }
      else {
        bVar1 = std::operator==(&local_120,"metal");
        if (bVar1) {
          std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_70,in_RDX);
          createMaterial_metal(this,in);
          this_01 = &local_70._M_refcount;
        }
        else {
          bVar1 = std::operator==(&local_120,"fourier");
          if (bVar1) {
            std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_80,in_RDX);
            createMaterial_fourier(this,(SP *)in_RDX);
            this_01 = &local_80._M_refcount;
          }
          else {
            bVar1 = std::operator==(&local_120,"mirror");
            if (bVar1) {
              std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_90,in_RDX);
              createMaterial_mirror(this,in);
              this_01 = &local_90._M_refcount;
            }
            else {
              bVar1 = std::operator==(&local_120,"uber");
              if (bVar1) {
                std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr(&local_a0,in_RDX);
                createMaterial_uber(this,in);
                this_01 = &local_a0._M_refcount;
              }
              else {
                bVar1 = std::operator==(&local_120,"substrate");
                if (bVar1) {
                  std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr(&local_b0,in_RDX);
                  createMaterial_substrate(this,in);
                  this_01 = &local_b0._M_refcount;
                }
                else {
                  bVar1 = std::operator==(&local_120,"disney");
                  if (bVar1) {
                    std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr(&local_c0,in_RDX);
                    createMaterial_disney(this,(SP *)in_RDX);
                    this_01 = &local_c0._M_refcount;
                  }
                  else {
                    bVar1 = std::operator==(&local_120,"mix");
                    if (bVar1) {
                      std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr(&local_d0,in_RDX);
                      createMaterial_mix(this,in);
                      this_01 = &local_d0._M_refcount;
                    }
                    else {
                      bVar1 = std::operator==(&local_120,"translucent");
                      if (bVar1) {
                        std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr(&local_e0,in_RDX);
                        createMaterial_translucent(this,in);
                        this_01 = &local_e0._M_refcount;
                      }
                      else {
                        bVar1 = std::operator==(&local_120,"glass");
                        if (bVar1) {
                          std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::
                          __shared_ptr(&local_f0,in_RDX);
                          createMaterial_glass(this,(SP *)in_RDX);
                          this_01 = &local_f0._M_refcount;
                        }
                        else {
                          bVar1 = std::operator==(&local_120,"hair");
                          if (!bVar1) goto LAB_0013bddf;
                          std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::
                          __shared_ptr(&local_100,in_RDX);
                          createMaterial_hair(this,(SP *)in_RDX);
                          this_01 = &local_100._M_refcount;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
  }
  std::__cxx11::string::~string((string *)&local_120);
  _Var3._M_pi = extraout_RDX_00;
LAB_0013c0eb:
  SVar4.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  SVar4.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SP)SVar4.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterialFrom(pbrt::syntactic::Material::SP in)
  {
    if (!in) {
      std::cerr << "warning: empty material!" << std::endl;
      return Material::SP();
    }
      
    const std::string type = in->type=="" ? in->getParamString("type") : in->type;

    // ==================================================================
    if (type == "") 
      return std::make_shared<Material>();
        
    // ==================================================================
    if (type == "plastic") 
      return createMaterial_plastic(in);
      
    // ==================================================================
    if (type == "matte")
      return createMaterial_matte(in);
      
    // ==================================================================
    if (type == "metal") 
      return createMaterial_metal(in);
      
    // ==================================================================
    if (type == "fourier") 
      return createMaterial_fourier(in);
      
    // ==================================================================
    if (type == "mirror") 
      return createMaterial_mirror(in);
      
    // ==================================================================
    if (type == "uber") 
      return createMaterial_uber(in);
      
    // ==================================================================
    if (type == "substrate") 
      return createMaterial_substrate(in);
      
    // ==================================================================
    if (type == "disney") 
      return createMaterial_disney(in);

    // ==================================================================
    if (type == "mix")
      return createMaterial_mix(in);

    // ==================================================================
    if (type == "translucent")
      return createMaterial_translucent(in);

    // ==================================================================
    if (type == "glass") 
      return createMaterial_glass(in);

    // ==================================================================
    if (type == "hair") 
      return createMaterial_hair(in);

    // ==================================================================
#ifndef NDEBUG
    std::cout << "Warning: un-recognizd material type '"+type+"'" << std::endl;
#endif
    return std::make_shared<Material>();
  }